

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

bool __thiscall
cashew::JSPrinter::needParens(JSPrinter *this,Ref parent,Ref child,int childPosition)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Value *this_00;
  Ref *pRVar4;
  undefined8 *puVar5;
  ulong uVar6;
  int childPrecedence;
  int parentPrecedence;
  int childPosition_local;
  JSPrinter *this_local;
  Ref child_local;
  Ref parent_local;
  
  this_local = (JSPrinter *)child.inst;
  child_local = parent;
  iVar2 = getPrecedence(this,parent,true);
  iVar3 = getPrecedence(this,(Ref)this_local,false);
  if (iVar2 < iVar3) {
    return true;
  }
  if (iVar3 < iVar2) {
    return false;
  }
  this_00 = Ref::operator->(&child_local);
  bVar1 = Value::isArray(this_00);
  if (bVar1) {
    pRVar4 = (Ref *)cashew::Ref::operator[]((uint)&child_local);
    uVar6 = cashew::Ref::operator==(pRVar4,(IString *)&UNARY_PREFIX);
    if ((uVar6 & 1) != 0) {
      pRVar4 = (Ref *)cashew::Ref::operator[]((uint)&this_local);
      uVar6 = cashew::Ref::operator==(pRVar4,(IString *)&UNARY_PREFIX);
      if ((uVar6 & 1) == 0) {
        __assert_fail("child[0] == UNARY_PREFIX",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                      ,0x471,"bool cashew::JSPrinter::needParens(Ref, Ref, int)");
      }
      pRVar4 = (Ref *)cashew::Ref::operator[]((uint)&child_local);
      uVar6 = cashew::Ref::operator==(pRVar4,(IString *)&PLUS);
      if ((uVar6 & 1) == 0) {
        pRVar4 = (Ref *)cashew::Ref::operator[]((uint)&child_local);
        uVar6 = cashew::Ref::operator==(pRVar4,(IString *)&MINUS);
        if ((uVar6 & 1) == 0) goto LAB_0027a8b8;
      }
      pRVar4 = (Ref *)cashew::Ref::operator[]((uint)&this_local);
      puVar5 = (undefined8 *)cashew::Ref::operator[]((uint)&child_local);
      uVar6 = cashew::Ref::operator==(pRVar4,(Value *)*puVar5);
      if ((uVar6 & 1) != 0) {
        return true;
      }
    }
  }
LAB_0027a8b8:
  if (childPosition == 0) {
    parent_local.inst._7_1_ = true;
  }
  else if (iVar3 < 0) {
    parent_local.inst._7_1_ = false;
  }
  else {
    uVar6 = cashew::OperatorClass::getRtl(iVar2);
    if ((uVar6 & 1) == 0) {
      parent_local.inst._7_1_ = 0 < childPosition;
    }
    else {
      parent_local.inst._7_1_ = childPosition < 0;
    }
  }
  return parent_local.inst._7_1_;
}

Assistant:

bool needParens(Ref parent, Ref child, int childPosition) {
    int parentPrecedence = getPrecedence(parent, true);
    int childPrecedence = getPrecedence(child, false);

    if (childPrecedence > parentPrecedence) {
      return true; // child is definitely a danger
    }
    if (childPrecedence < parentPrecedence) {
      return false; //          definitely cool
    }
    // equal precedence, so associativity (rtl/ltr) is what matters
    // (except for some exceptions, where multiple operators can combine into
    // confusion)
    if (parent->isArray() && parent[0] == UNARY_PREFIX) {
      assert(child[0] == UNARY_PREFIX);
      if ((parent[1] == PLUS || parent[1] == MINUS) && child[1] == parent[1]) {
        // cannot emit ++x when we mean +(+x)
        return true;
      }
    }
    if (childPosition == 0) {
      return true; // child could be anywhere, so always paren
    }
    if (childPrecedence < 0) {
      return false; // both precedences are safe
    }
    // check if child is on the dangerous side
    if (OperatorClass::getRtl(parentPrecedence)) {
      return childPosition < 0;
    } else {
      return childPosition > 0;
    }
  }